

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.hpp
# Opt level: O3

void __thiscall tcmalloc::CentralFreelist::Populate(CentralFreelist *this)

{
  Span *pSVar1;
  bool bVar2;
  PageHeap *pPVar3;
  Span *span;
  uint64_t uVar4;
  
  pPVar3 = PageHeap::Instance();
  span = PageHeap::New(pPVar3,this->class_pages_);
  if (span->npages != this->class_pages_) {
    __assert_fail("span->npages == class_pages_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/central_freelist.hpp"
                  ,0x8e,"void tcmalloc::CentralFreelist::Populate()");
  }
  pPVar3 = PageHeap::Instance();
  PageHeap::RegisterSizeClass(pPVar3,span,(long)this->class_);
  uVar4 = Span::InitFreeList(span,this->class_bytes_);
  this->free_objects_ = this->free_objects_ + uVar4;
  if (0 < (int)(span->freelist).free_count_) {
    this->span_nums_ = this->span_nums_ + 1;
    span->prev = &this->nonempty_;
    pSVar1 = (this->nonempty_).next;
    span->next = pSVar1;
    pSVar1->prev = span;
    (this->nonempty_).next = span;
    bVar2 = CheckState(this);
    if (bVar2) {
      return;
    }
    __assert_fail("CheckState()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/central_freelist.hpp"
                  ,0x94,"void tcmalloc::CentralFreelist::Populate()");
  }
  __assert_fail("span->freelist.FreeObjects() > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/central_freelist.hpp"
                ,0x92,"void tcmalloc::CentralFreelist::Populate()");
}

Assistant:

void Populate() {
        Span* span = PageHeap::Instance()->New(class_pages_);
        assert(span->npages == class_pages_);
        PageHeap::Instance()->RegisterSizeClass(span, class_);

        free_objects_ += span->InitFreeList(class_bytes_);
        assert(span->freelist.FreeObjects() > 0);
        InsertToList(&nonempty_, span);
        assert(CheckState());
    }